

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O3

void __thiscall
google::protobuf::internal::TcParser::
WriteLengthDelimitedToUnknown<google::protobuf::UnknownFieldSet>
          (TcParser *this,MessageLite *msg,int number,string_view value)

{
  string *psVar1;
  UnknownFieldSet *this_00;
  
  if ((*(ulong *)(this + 8) & 1) == 0) {
    this_00 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                        ((InternalMetadata *)(this + 8));
  }
  else {
    this_00 = (UnknownFieldSet *)((*(ulong *)(this + 8) & 0xfffffffffffffffe) + 8);
  }
  psVar1 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this_00,(int)msg);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)psVar1->_M_string_length,value._M_len);
  return;
}

Assistant:

static void WriteLengthDelimitedToUnknown(MessageLite* msg, int number,
                                            absl::string_view value) {
    internal::WriteLengthDelimited(
        number, value,
        msg->_internal_metadata_.mutable_unknown_fields<UnknownFieldsT>());
  }